

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanInstance.cpp
# Opt level: O1

void __thiscall VulkanUtilities::VulkanInstance::VulkanInstance(VulkanInstance *this,CreateInfo *CI)

{
  vector<VkLayerProperties,_std::allocator<VkLayerProperties>_> *this_00;
  vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *this_01;
  vector<const_char_*,_std::allocator<const_char_*>_> *pvVar1;
  vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_> *this_02;
  uint32_t *Args;
  VkInstance *ppVVar2;
  VkInstanceCreateFlags *pVVar3;
  VkStructureType VVar4;
  pointer pVVar5;
  pointer pVVar6;
  pointer ppcVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  bool bVar9;
  VkResult VVar10;
  int iVar11;
  undefined4 uVar12;
  size_t sVar13;
  ostream *poVar14;
  char *pcVar15;
  char (*Args_1) [30];
  pointer pVVar16;
  _Alloc_hider __s1;
  uint uVar17;
  vector<VkLayerProperties,_std::allocator<VkLayerProperties>_> *__range3;
  char *in_R8;
  VkLayerProperties *Layer;
  pointer pVVar18;
  CreateInfo *pCVar19;
  VkStructureType VVar20;
  pointer ppcVar21;
  ulong uVar22;
  pointer __s1_00;
  _Alloc_hider __s1_01;
  bool bVar23;
  VulkanInstance *pVVar24;
  uint32_t PhysicalDeviceCount;
  vector<const_char_*,_std::allocator<const_char_*>_> InstanceExtensions;
  char *LayerName;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  CreateInfo *local_258;
  undefined1 local_24c;
  undefined1 local_24b;
  undefined1 local_24a;
  undefined1 local_249;
  uint32_t LayerCount;
  uint uStack_244;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  char *local_228;
  uint32_t uStack_220;
  VkStructureType VStack_21c;
  vector<const_char_*,_std::allocator<const_char_*>_> InstanceLayers;
  vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *__range2;
  VkInstanceCreateInfo InstanceCreateInfo;
  ios_base local_158 [272];
  vector<VkLayerProperties,_std::allocator<VkLayerProperties>_> *__range1;
  undefined4 local_40;
  undefined4 local_3c;
  char local_38 [4];
  uint local_34;
  
  (this->super_enable_shared_from_this<VulkanUtilities::VulkanInstance>)._M_weak_this.
  super___weak_ptr<VulkanUtilities::VulkanInstance,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_enable_shared_from_this<VulkanUtilities::VulkanInstance>)._M_weak_this.
  super___weak_ptr<VulkanUtilities::VulkanInstance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->m_DebugMode = Disabled;
  this->m_pVkAllocator = CI->pVkAllocator;
  this->m_VkInstance = (VkInstance)0x0;
  this->m_VkVersion = 0x400000;
  this_00 = &this->m_Layers;
  this_01 = &this->m_Extensions;
  pvVar1 = &this->m_EnabledExtensions;
  this_02 = &this->m_PhysicalDevices;
  (this->m_Layers).super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_Layers).super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_Layers).super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_Extensions).
  super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_Extensions).
  super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_Extensions).
  super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_EnabledExtensions).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_EnabledExtensions).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_EnabledExtensions).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_PhysicalDevices).
  super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_PhysicalDevices).
  super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_PhysicalDevices).
  super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  VVar10 = volkInitialize();
  if (VVar10 != VK_SUCCESS) {
    in_R8 = "Failed to load Vulkan.";
    Diligent::LogError<true,char[23]>
              (false,"VulkanInstance",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanInstance.cpp"
               ,0x103,(char (*) [23])"Failed to load Vulkan.");
  }
  _LayerCount = (pointer)((ulong)uStack_244 << 0x20);
  VVar10 = (*vkEnumerateInstanceLayerProperties)(&LayerCount,(VkLayerProperties *)0x0);
  if (VVar10 != VK_SUCCESS) {
    InstanceCreateInfo._0_8_ = VkResultToString(VVar10);
    in_R8 = "Failed to query layer count";
    Diligent::LogError<true,char[28],char[17],char_const*>
              (false,"VulkanInstance",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanInstance.cpp"
               ,0x10c,(char (*) [28])"Failed to query layer count",
               (char (*) [17])"\nVK Error Code: ",(char **)&InstanceCreateInfo);
  }
  std::vector<VkLayerProperties,_std::allocator<VkLayerProperties>_>::resize
            (this_00,(ulong)_LayerCount & 0xffffffff);
  (*vkEnumerateInstanceLayerProperties)
            (&LayerCount,
             (this_00->super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>).
             _M_impl.super__Vector_impl_data._M_start);
  if (VVar10 != VK_SUCCESS) {
    InstanceCreateInfo._0_8_ = VkResultToString(VVar10);
    in_R8 = "Failed to enumerate extensions";
    Diligent::LogError<true,char[31],char[17],char_const*>
              (false,"VulkanInstance",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanInstance.cpp"
               ,0x10f,(char (*) [31])"Failed to enumerate extensions",
               (char (*) [17])"\nVK Error Code: ",(char **)&InstanceCreateInfo);
  }
  Args_1 = (char (*) [30])
           ((long)(this->m_Layers).
                  super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->m_Layers).
                  super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3);
  if ((long)Args_1 * 0xfc0fc0fc0fc0fc1 - ((ulong)_LayerCount & 0xffffffff) != 0) {
    Diligent::FormatString<char[26],char[30]>
              ((string *)&InstanceCreateInfo,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"LayerCount == m_Layers.size()",Args_1);
    Diligent::DebugAssertionFailed
              ((Char *)InstanceCreateInfo._0_8_,"VulkanInstance",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanInstance.cpp"
               ,0x110);
    if ((VkInstanceCreateFlags *)InstanceCreateInfo._0_8_ != &InstanceCreateInfo.flags) {
      operator_delete((void *)InstanceCreateInfo._0_8_,InstanceCreateInfo._16_8_ + 1);
    }
  }
  local_258 = CI;
  if (CI->LogExtensions == true) {
    if ((this->m_Layers).super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        (this->m_Layers).super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      Diligent::FormatString<char[32]>
                ((string *)&InstanceCreateInfo,(char (*) [32])"No Vulkan instance layers found");
      if (Diligent::DebugMessageCallback != (undefined *)0x0) {
        in_R8 = (char *)0x0;
        (*(code *)Diligent::DebugMessageCallback)(0,InstanceCreateInfo._0_8_,0,0);
      }
      if ((VkInstanceCreateFlags *)InstanceCreateInfo._0_8_ != &InstanceCreateInfo.flags) {
        operator_delete((void *)InstanceCreateInfo._0_8_,InstanceCreateInfo._16_8_ + 1);
      }
    }
    else {
      pVVar24 = this;
      std::__cxx11::stringstream::stringstream((stringstream *)&InstanceCreateInfo);
      pVVar18 = (pVVar24->m_Layers).
                super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>._M_impl.
                super__Vector_impl_data._M_start;
      pVVar5 = (pVVar24->m_Layers).
               super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (pVVar18 != pVVar5) {
        pVVar3 = &InstanceCreateInfo.flags;
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)pVVar3,"\n    ",5);
          if (pVVar18 == (pointer)0x0) {
            std::ios::clear((int)*(undefined8 *)(InstanceCreateInfo._16_8_ + -0x18) + (int)pVVar3);
          }
          else {
            sVar13 = strlen(pVVar18->layerName);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)pVVar3,pVVar18->layerName,sVar13);
          }
          LayerCount._0_1_ = 0x20;
          poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)pVVar3,(char *)&LayerCount,1);
          poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)poVar14);
          LayerCount._0_1_ = 0x2e;
          poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar14,(char *)&LayerCount,1);
          poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)poVar14);
          LayerCount._0_1_ = 0x2e;
          poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar14,(char *)&LayerCount,1);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar14);
          pVVar18 = pVVar18 + 1;
        } while (pVVar18 != pVVar5);
      }
      std::__cxx11::stringbuf::str();
      Diligent::FormatString<char[35],std::__cxx11::string>
                ((string *)&LayerCount,(Diligent *)"Available Vulkan instance layers: ",
                 (char (*) [35])&LayerName,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
      CI = local_258;
      this = pVVar24;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)LayerName != &local_268) {
        operator_delete(LayerName,local_268._M_allocated_capacity + 1);
        this = pVVar24;
      }
      if (Diligent::DebugMessageCallback != (undefined *)0x0) {
        in_R8 = (char *)0x0;
        (*(code *)Diligent::DebugMessageCallback)(0,_LayerCount,0,0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_LayerCount != &local_238) {
        operator_delete(_LayerCount,local_238._M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)&InstanceCreateInfo);
      std::ios_base::~ios_base(local_158);
    }
  }
  bVar9 = anon_unknown_1::EnumerateInstanceExtensions((char *)0x0,this_01);
  if (!bVar9) {
    in_R8 = "Failed to enumerate instance extensions";
    Diligent::LogError<true,char[40]>
              (false,"VulkanInstance",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanInstance.cpp"
               ,0x12a,(char (*) [40])"Failed to enumerate instance extensions");
  }
  if (CI->LogExtensions == true) {
    if ((this->m_Extensions).
        super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (this->m_Extensions).
        super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      Diligent::FormatString<char[36]>
                ((string *)&InstanceCreateInfo,(char (*) [36])"No Vulkan instance extensions found")
      ;
      if (Diligent::DebugMessageCallback != (undefined *)0x0) {
        in_R8 = (char *)0x0;
        (*(code *)Diligent::DebugMessageCallback)(0,InstanceCreateInfo._0_8_,0,0);
      }
    }
    else {
      pVVar24 = this;
      PrintExtensionsList_abi_cxx11_
                ((string *)&LayerCount,(VulkanUtilities *)this_01,
                 (vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)0x1,
                 (size_t)this);
      Diligent::FormatString<char[39],std::__cxx11::string>
                ((string *)&InstanceCreateInfo,(Diligent *)"Supported Vulkan instance extensions: ",
                 (char (*) [39])&LayerCount,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
      this = pVVar24;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_LayerCount != &local_238) {
        operator_delete(_LayerCount,local_238._M_allocated_capacity + 1);
        this = pVVar24;
      }
      if (Diligent::DebugMessageCallback != (undefined *)0x0) {
        in_R8 = (char *)0x0;
        (*(code *)Diligent::DebugMessageCallback)(0,InstanceCreateInfo._0_8_,0,0);
      }
    }
    if ((VkInstanceCreateFlags *)InstanceCreateInfo._0_8_ != &InstanceCreateInfo.flags) {
      operator_delete((void *)InstanceCreateInfo._0_8_,InstanceCreateInfo._16_8_ + 1);
    }
  }
  InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pVVar16 = (this->m_Extensions).
            super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pVVar6 = (this->m_Extensions).
           super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl
           .super__Vector_impl_data._M_finish;
  bVar9 = pVVar16 != pVVar6;
  __range1 = this_00;
  if (bVar9) {
    iVar11 = strcmp(pVVar16->extensionName,"VK_KHR_surface");
    while (iVar11 != 0) {
      pVVar16 = pVVar16 + 1;
      bVar9 = pVVar16 != pVVar6;
      if (pVVar16 == pVVar6) break;
      iVar11 = strcmp(pVVar16->extensionName,"VK_KHR_surface");
    }
  }
  if (bVar9) {
    InstanceCreateInfo._0_8_ = anon_var_dwarf_21589d;
    if (InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&InstanceExtensions,
                 (iterator)
                 InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish,(char **)&InstanceCreateInfo);
    }
    else {
      *InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
       super__Vector_impl_data._M_finish = "VK_KHR_surface";
      InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish =
           InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    InstanceCreateInfo._0_8_ = anon_var_dwarf_70aa67;
    if (InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&InstanceExtensions,
                 (iterator)
                 InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish,(char **)&InstanceCreateInfo);
    }
    else {
      *InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
       super__Vector_impl_data._M_finish = "VK_KHR_xlib_surface";
      InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish =
           InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    InstanceCreateInfo._0_8_ = anon_var_dwarf_70aa73;
    if (InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&InstanceExtensions,
                 (iterator)
                 InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish,(char **)&InstanceCreateInfo);
    }
    else {
      *InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
       super__Vector_impl_data._M_finish = "VK_KHR_xcb_surface";
      InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish =
           InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
  }
  pVVar16 = (this->m_Extensions).
            super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pVVar6 = (this->m_Extensions).
           super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl
           .super__Vector_impl_data._M_finish;
  bVar9 = pVVar16 != pVVar6;
  if (bVar9) {
    iVar11 = strcmp(pVVar16->extensionName,"VK_KHR_get_physical_device_properties2");
    while (iVar11 != 0) {
      pVVar16 = pVVar16 + 1;
      bVar9 = pVVar16 != pVVar6;
      if (pVVar16 == pVVar6) break;
      iVar11 = strcmp(pVVar16->extensionName,"VK_KHR_get_physical_device_properties2");
    }
  }
  if (bVar9) {
    InstanceCreateInfo._0_8_ = anon_var_dwarf_215949;
    if (InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&InstanceExtensions,
                 (iterator)
                 InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish,(char **)&InstanceCreateInfo);
    }
    else {
      *InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
       super__Vector_impl_data._M_finish = "VK_KHR_get_physical_device_properties2";
      InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish =
           InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
  }
  ppcVar7 = InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ppcVar21 = InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    do {
      InstanceCreateInfo._0_8_ = *ppcVar21;
      bVar9 = anon_unknown_1::IsExtensionAvailable(this_01,(char *)InstanceCreateInfo._0_8_);
      if (!bVar9) {
        in_R8 = "Required extension ";
        Diligent::LogError<true,char[20],char_const*,char[18]>
                  (false,"VulkanInstance",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanInstance.cpp"
                   ,0x162,(char (*) [20])"Required extension ",(char **)&InstanceCreateInfo,
                   (char (*) [18])" is not available");
      }
      ppcVar21 = ppcVar21 + 1;
    } while (ppcVar21 != ppcVar7);
  }
  Args = &local_258->ExtensionCount;
  if (local_258->ppExtensionNames == (char **)0x0) {
    if (local_258->ExtensionCount != 0) {
      Diligent::FormatString<char[61],unsigned_int,char[84]>
                ((string *)&InstanceCreateInfo,
                 (Diligent *)"Global extensions pointer is null while extensions count is ",
                 (char (*) [61])Args,
                 (uint *)
                 ". Please initialize \'ppInstanceExtensionNames\' member of EngineVkCreateInfo struct."
                 ,(char (*) [84])in_R8);
      Diligent::DebugAssertionFailed
                ((Char *)InstanceCreateInfo._0_8_,"VulkanInstance",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanInstance.cpp"
                 ,0x176);
      if ((VkInstanceCreateFlags *)InstanceCreateInfo._0_8_ != &InstanceCreateInfo.flags) {
        operator_delete((void *)InstanceCreateInfo._0_8_,InstanceCreateInfo._16_8_ + 1);
      }
    }
  }
  else if (local_258->ExtensionCount != 0) {
    uVar22 = 0;
    do {
      _LayerCount = local_258->ppExtensionNames[uVar22];
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_LayerCount !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        bVar9 = anon_unknown_1::IsExtensionAvailable(this_01,_LayerCount);
        if (bVar9) {
          if (InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<char_const*,std::allocator<char_const*>>::
            _M_realloc_insert<char_const*const&>
                      ((vector<char_const*,std::allocator<char_const*>> *)&InstanceExtensions,
                       (iterator)
                       InstanceExtensions.
                       super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                       super__Vector_impl_data._M_finish,(char **)&LayerCount);
          }
          else {
            *InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
             _M_impl.super__Vector_impl_data._M_finish = _LayerCount;
            InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1;
          }
        }
        else {
          Diligent::FormatString<char[11],char_const*,char[18]>
                    ((string *)&InstanceCreateInfo,(Diligent *)"Extension ",
                     (char (*) [11])&LayerCount,(char **)" is not available",(char (*) [18])in_R8);
          if (Diligent::DebugMessageCallback != (undefined *)0x0) {
            in_R8 = (char *)0x0;
            (*(code *)Diligent::DebugMessageCallback)(1,InstanceCreateInfo._0_8_,0,0);
          }
          if ((VkInstanceCreateFlags *)InstanceCreateInfo._0_8_ != &InstanceCreateInfo.flags) {
            operator_delete((void *)InstanceCreateInfo._0_8_,InstanceCreateInfo._16_8_ + 1);
          }
        }
      }
      uVar22 = uVar22 + 1;
    } while (uVar22 < *Args);
  }
  pCVar19 = local_258;
  VVar4 = local_258->ApiVersion;
  VVar20 = 0x400000;
  if (0x400000 < VVar4 && vkEnumerateInstanceVersion != (PFN_vkEnumerateInstanceVersion)0x0) {
    InstanceCreateInfo._0_8_ = InstanceCreateInfo._0_8_ & 0xffffffff00000000;
    (*vkEnumerateInstanceVersion)(&InstanceCreateInfo.sType);
    VVar20 = VVar4;
    if (InstanceCreateInfo.sType < VVar4) {
      VVar20 = InstanceCreateInfo.sType;
    }
  }
  pcVar15 = VulkanInstance::DeviceSimulationLayer;
  InstanceLayers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  InstanceLayers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  InstanceLayers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pCVar19->EnableDeviceSimulation == true) {
    pVVar18 = (this->m_Layers).
              super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>._M_impl.
              super__Vector_impl_data._M_start;
    pVVar5 = (this->m_Layers).
             super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>._M_impl.
             super__Vector_impl_data._M_finish;
    bVar9 = pVVar18 != pVVar5;
    if (bVar9) {
      iVar11 = strcmp(pVVar18->layerName,VulkanInstance::DeviceSimulationLayer);
      while (iVar11 != 0) {
        pVVar18 = pVVar18 + 1;
        bVar9 = pVVar18 != pVVar5;
        if (pVVar18 == pVVar5) break;
        iVar11 = strcmp(pVVar18->layerName,pcVar15);
      }
    }
    if (bVar9) {
      if (InstanceLayers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          InstanceLayers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*const&>
                  ((vector<char_const*,std::allocator<char_const*>> *)&InstanceLayers,
                   (iterator)
                   InstanceLayers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish,&VulkanInstance::DeviceSimulationLayer)
        ;
      }
      else {
        *InstanceLayers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
         super__Vector_impl_data._M_finish = pcVar15;
        InstanceLayers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_finish =
             InstanceLayers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
    }
  }
  if (pCVar19->EnableValidation == true) {
    pVVar16 = (this->m_Extensions).
              super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pVVar6 = (this->m_Extensions).
             super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    bVar23 = pVVar16 != pVVar6;
    bVar9 = bVar23;
    if (bVar23) {
      iVar11 = strcmp(pVVar16->extensionName,"VK_EXT_debug_utils");
      __s1_00 = pVVar16;
      while (iVar11 != 0) {
        __s1_00 = __s1_00 + 1;
        bVar9 = __s1_00 != pVVar6;
        if (__s1_00 == pVVar6) break;
        iVar11 = strcmp(__s1_00->extensionName,"VK_EXT_debug_utils");
      }
    }
    uVar12 = 1;
    if (bVar9) {
LAB_0028d663:
      *(undefined4 *)&this->m_DebugMode = uVar12;
    }
    else {
      if (pVVar16 != pVVar6) {
        iVar11 = strcmp(pVVar16->extensionName,"VK_EXT_debug_report");
        while (iVar11 != 0) {
          pVVar16 = pVVar16 + 1;
          bVar23 = pVVar16 != pVVar6;
          if (pVVar16 == pVVar6) break;
          iVar11 = strcmp(pVVar16->extensionName,"VK_EXT_debug_report");
        }
      }
      uVar12 = 2;
      if (bVar23) goto LAB_0028d663;
    }
    LayerName = "VK_LAYER_KHRONOS_validation";
    pVVar18 = (this->m_Layers).
              super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>._M_impl.
              super__Vector_impl_data._M_start;
    pVVar5 = (this->m_Layers).
             super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>._M_impl.
             super__Vector_impl_data._M_finish;
    uVar17 = 0xffffffff;
    bVar9 = pVVar18 != pVVar5;
    if (bVar9) {
      iVar11 = strcmp(pVVar18->layerName,"VK_LAYER_KHRONOS_validation");
      while (iVar11 != 0) {
        pVVar18 = pVVar18 + 1;
        bVar9 = pVVar18 != pVVar5;
        if (pVVar18 == pVVar5) goto LAB_0028d6cf;
        iVar11 = strcmp(pVVar18->layerName,"VK_LAYER_KHRONOS_validation");
      }
      uVar17 = pVVar18->specVersion;
    }
LAB_0028d6cf:
    pCVar19 = local_258;
    if (bVar9) {
      if (uVar17 < 0x404135) {
        in_R8 = (char *)&LayerCount;
        LayerCount = uVar17 >> 0x16;
        local_249 = 0x2e;
        PhysicalDeviceCount = uVar17 >> 0xc & 0x3ff;
        local_24a = 0x2e;
        local_34 = uVar17 & 0xfff;
        local_38[0] = '\x01';
        local_38[1] = '\0';
        local_38[2] = '\0';
        local_38[3] = '\0';
        local_24b = 0x2e;
        local_3c = 4;
        local_24c = 0x2e;
        local_40 = 0x135;
        Diligent::
        FormatString<char[8],char_const*,char[12],unsigned_int,char,unsigned_int,char,unsigned_int,char[36],unsigned_int,char,unsigned_int,char,unsigned_int,char[3]>
                  ((string *)&InstanceCreateInfo,(Diligent *)"Layer \'",(char (*) [8])&LayerName,
                   (char **)"\' version (",(char (*) [12])in_R8,(uint *)&local_249,
                   (char *)&PhysicalDeviceCount,(uint *)&local_24a,(char *)&local_34,
                   (uint *)") is less than the header version (",(char (*) [36])local_38,
                   (uint *)&local_24b,(char *)&local_3c,(uint *)&local_24c,(char *)&local_40,
                   (uint *)0x773e90,(char (*) [3])this);
        if (Diligent::DebugMessageCallback != (undefined *)0x0) {
          in_R8 = (char *)0x0;
          (*(code *)Diligent::DebugMessageCallback)(1,InstanceCreateInfo._0_8_,0,0);
        }
        pCVar19 = local_258;
        if ((VkInstanceCreateFlags *)InstanceCreateInfo._0_8_ != &InstanceCreateInfo.flags) {
          operator_delete((void *)InstanceCreateInfo._0_8_,InstanceCreateInfo._16_8_ + 1);
        }
      }
      if (InstanceLayers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          InstanceLayers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*const&>
                  ((vector<char_const*,std::allocator<char_const*>> *)&InstanceLayers,
                   (iterator)
                   InstanceLayers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish,&LayerName);
      }
      else {
        *InstanceLayers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
         super__Vector_impl_data._M_finish = LayerName;
        InstanceLayers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_finish =
             InstanceLayers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      if (*(int *)&this->m_DebugMode != 1) {
        _LayerCount = (pointer)0x0;
        paStack_240 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0;
        local_238._M_allocated_capacity = 0;
        bVar9 = anon_unknown_1::EnumerateInstanceExtensions
                          (LayerName,
                           (vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)
                           &LayerCount);
        paVar8 = paStack_240;
        __s1._M_p = _LayerCount;
        if (bVar9) {
          bVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)_LayerCount != paStack_240;
          bVar9 = bVar23;
          if (bVar23) {
            iVar11 = strcmp(_LayerCount,"VK_EXT_debug_utils");
            __s1_01._M_p = __s1._M_p;
            while (iVar11 != 0) {
              __s1_01._M_p = __s1_01._M_p + 0x104;
              bVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)__s1_01._M_p != paVar8;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)__s1_01._M_p == paVar8) break;
              iVar11 = strcmp(__s1_01._M_p,"VK_EXT_debug_utils");
            }
          }
          if (bVar9) {
            *(undefined4 *)&this->m_DebugMode = 1;
          }
          if (*(int *)&this->m_DebugMode == 0) {
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)__s1._M_p != paVar8) {
              iVar11 = strcmp(__s1._M_p,"VK_EXT_debug_report");
              while (iVar11 != 0) {
                __s1._M_p = __s1._M_p + 0x104;
                bVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)__s1._M_p != paVar8;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)__s1._M_p == paVar8) break;
                iVar11 = strcmp(__s1._M_p,"VK_EXT_debug_report");
              }
            }
            if (bVar23) {
              *(undefined4 *)&this->m_DebugMode = 2;
            }
          }
        }
        else {
          Diligent::FormatString<char[36],char_const*,char[7]>
                    ((string *)&InstanceCreateInfo,(Diligent *)"Failed to enumerate extensions for "
                     ,(char (*) [36])&LayerName,(char **)" layer",(char (*) [7])in_R8);
          if (Diligent::DebugMessageCallback != (undefined *)0x0) {
            in_R8 = (char *)0x0;
            (*(code *)Diligent::DebugMessageCallback)(2,InstanceCreateInfo._0_8_,0,0);
          }
          if ((VkInstanceCreateFlags *)InstanceCreateInfo._0_8_ != &InstanceCreateInfo.flags) {
            operator_delete((void *)InstanceCreateInfo._0_8_,InstanceCreateInfo._16_8_ + 1);
          }
        }
        pCVar19 = local_258;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_LayerCount !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(_LayerCount,local_238._M_allocated_capacity - (long)_LayerCount);
          pCVar19 = local_258;
        }
      }
    }
    else {
      Diligent::FormatString<char[18],char_const*,char[19]>
                ((string *)&InstanceCreateInfo,(Diligent *)"Validation layer ",
                 (char (*) [18])&LayerName,(char **)" is not available.",(char (*) [19])in_R8);
      if (Diligent::DebugMessageCallback != (undefined *)0x0) {
        in_R8 = (char *)0x0;
        (*(code *)Diligent::DebugMessageCallback)(1,InstanceCreateInfo._0_8_,0,0);
      }
      if ((VkInstanceCreateFlags *)InstanceCreateInfo._0_8_ != &InstanceCreateInfo.flags) {
        operator_delete((void *)InstanceCreateInfo._0_8_,InstanceCreateInfo._16_8_ + 1);
      }
    }
    if (*(int *)&this->m_DebugMode == 1) {
      pcVar15 = "VK_EXT_debug_utils";
      InstanceCreateInfo._0_8_ = anon_var_dwarf_712233;
      if (InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
          .super__Vector_impl_data._M_finish ==
          InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage) {
        std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                  ((vector<char_const*,std::allocator<char_const*>> *)&InstanceExtensions,
                   (iterator)
                   InstanceExtensions.
                   super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                   super__Vector_impl_data._M_finish,(char **)&InstanceCreateInfo);
      }
      else {
LAB_0028da9a:
        *InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
         super__Vector_impl_data._M_finish = pcVar15;
        InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_finish =
             InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
             _M_impl.super__Vector_impl_data._M_finish + 1;
      }
    }
    else if (*(int *)&this->m_DebugMode == 2) {
      pcVar15 = "VK_EXT_debug_report";
      InstanceCreateInfo._0_8_ = anon_var_dwarf_71223f;
      if (InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
          .super__Vector_impl_data._M_finish !=
          InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage) goto LAB_0028da9a;
      std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&InstanceExtensions,
                 (iterator)
                 InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish,(char **)&InstanceCreateInfo);
    }
    else {
      in_R8 = "VK_EXT_debug_report";
      Diligent::FormatString<char[9],char[19],char[6],char[20],char[117]>
                ((string *)&InstanceCreateInfo,(Diligent *)"Neither ",
                 (char (*) [9])"VK_EXT_debug_utils",(char (*) [19])" nor ",
                 (char (*) [6])"VK_EXT_debug_report",
                 (char (*) [20])
                 " extension is available. Debug tools (validation layer message logging, performance markers, etc.) will be disabled."
                 ,(char (*) [117])this);
      if (Diligent::DebugMessageCallback != (undefined *)0x0) {
        in_R8 = (char *)0x0;
        (*(code *)Diligent::DebugMessageCallback)(1,InstanceCreateInfo._0_8_,0,0);
      }
      if ((VkInstanceCreateFlags *)InstanceCreateInfo._0_8_ != &InstanceCreateInfo.flags) {
        operator_delete((void *)InstanceCreateInfo._0_8_,InstanceCreateInfo._16_8_ + 1);
      }
    }
  }
  if ((pCVar19->ppEnabledLayerNames != (char **)0x0) && (pCVar19->EnabledLayerCount != 0)) {
    uVar22 = 0;
    do {
      pcVar15 = pCVar19->ppEnabledLayerNames[uVar22];
      _LayerCount = pcVar15;
      if (pcVar15 == (char *)0x0) goto LAB_0028e064;
      pVVar18 = (this->m_Layers).
                super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>._M_impl.
                super__Vector_impl_data._M_start;
      pVVar5 = (this->m_Layers).
               super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>._M_impl.
               super__Vector_impl_data._M_finish;
      bVar9 = pVVar18 != pVVar5;
      if (bVar9) {
        iVar11 = strcmp(pVVar18->layerName,pcVar15);
        while (iVar11 != 0) {
          pVVar18 = pVVar18 + 1;
          bVar9 = pVVar18 != pVVar5;
          if (pVVar18 == pVVar5) break;
          iVar11 = strcmp(pVVar18->layerName,pcVar15);
        }
      }
      pCVar19 = local_258;
      if (bVar9) {
        if (InstanceLayers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            InstanceLayers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*const&>
                    ((vector<char_const*,std::allocator<char_const*>> *)&InstanceLayers,
                     (iterator)
                     InstanceLayers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(char **)&LayerCount);
        }
        else {
          *InstanceLayers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
           super__Vector_impl_data._M_finish = pcVar15;
          InstanceLayers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_finish =
               InstanceLayers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
               _M_impl.super__Vector_impl_data._M_finish + 1;
        }
      }
      else {
        Diligent::FormatString<char[16],char_const*,char[18]>
                  ((string *)&InstanceCreateInfo,(Diligent *)"Instance layer ",
                   (char (*) [16])&LayerCount,(char **)" is not available",(char (*) [18])in_R8);
        pCVar19 = local_258;
        if (Diligent::DebugMessageCallback != (undefined *)0x0) {
          in_R8 = (char *)0x0;
          (*(code *)Diligent::DebugMessageCallback)(1,InstanceCreateInfo._0_8_,0,0);
        }
        if ((VkInstanceCreateFlags *)InstanceCreateInfo._0_8_ != &InstanceCreateInfo.flags) {
          operator_delete((void *)InstanceCreateInfo._0_8_,InstanceCreateInfo._16_8_ + 1);
        }
      }
      uVar22 = uVar22 + 1;
    } while (uVar22 < pCVar19->EnabledLayerCount);
  }
  ppVVar2 = &this->m_VkInstance;
  local_238._M_allocated_capacity = 0;
  local_238._8_8_ = 0;
  _LayerCount = (char *)0x0;
  paStack_240 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
  local_228 = "Diligent Engine";
  VStack_21c = VVar20;
  uStack_220 = 0x3e808;
  InstanceCreateInfo.sType = VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO;
  InstanceCreateInfo._4_4_ = 0;
  InstanceCreateInfo.pNext = (void *)0x0;
  InstanceCreateInfo.flags = 0;
  InstanceCreateInfo._20_4_ = 0;
  InstanceCreateInfo.pApplicationInfo = (VkApplicationInfo *)&LayerCount;
  InstanceCreateInfo.ppEnabledExtensionNames =
       InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  if ((long)InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
            _M_impl.super__Vector_impl_data._M_start == 0) {
    InstanceCreateInfo.ppEnabledExtensionNames = (pointer)0x0;
  }
  InstanceCreateInfo._48_8_ =
       (ulong)((long)InstanceExtensions.
                     super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                     super__Vector_impl_data._M_finish -
              (long)InstanceExtensions.
                    super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                    super__Vector_impl_data._M_start) >> 3 & 0xffffffff;
  InstanceCreateInfo.ppEnabledLayerNames =
       InstanceLayers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  if ((long)InstanceLayers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)InstanceLayers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_start == 0) {
    InstanceCreateInfo.ppEnabledLayerNames = (pointer)0x0;
  }
  InstanceCreateInfo._32_8_ =
       (ulong)((long)InstanceLayers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
              (long)InstanceLayers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                    _M_impl.super__Vector_impl_data._M_start) >> 3 & 0xffffffff;
  VVar10 = (*vkCreateInstance)(&InstanceCreateInfo,this->m_pVkAllocator,ppVVar2);
  if (VVar10 != VK_SUCCESS) {
    LayerName = VkResultToString(VVar10);
    Diligent::LogError<true,char[33],char[17],char_const*>
              (false,"VulkanInstance",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanInstance.cpp"
               ,0x221,(char (*) [33])"Failed to create Vulkan instance",
               (char (*) [17])"\nVK Error Code: ",&LayerName);
  }
  volkLoadInstance(*ppVVar2);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::_M_move_assign
            (pvVar1,&InstanceExtensions);
  this->m_VkVersion = VVar20;
  if (*(int *)&this->m_DebugMode == 2) {
    bVar9 = SetupDebugReport(*ppVVar2,VK_DEBUG_REPORT_ERROR_BIT_EXT|
                                      VK_DEBUG_REPORT_PERFORMANCE_WARNING_BIT_EXT|
                                      VK_DEBUG_REPORT_WARNING_BIT_EXT,(void *)0x0);
    if (bVar9) goto LAB_0028de65;
    Diligent::FormatString<char[86]>
              ((string *)&LayerName,
               (char (*) [86])
               "Failed to initialize debug report. Validation layer message logging will be disabled."
              );
    if (Diligent::DebugMessageCallback != (undefined *)0x0) {
      (*(code *)Diligent::DebugMessageCallback)(2,LayerName,0,0,0);
    }
  }
  else {
    if ((*(int *)&this->m_DebugMode != 1) ||
       (bVar9 = SetupDebugUtils(*ppVVar2,0x1100,7,local_258->IgnoreDebugMessageCount,
                                local_258->ppIgnoreDebugMessageNames,(void *)0x0), bVar9))
    goto LAB_0028de65;
    Diligent::FormatString<char[112]>
              ((string *)&LayerName,
               (char (*) [112])
               "Failed to initialize debug utils. Validation layer message logging, performance markers, etc. will be disabled."
              );
    if (Diligent::DebugMessageCallback != (undefined *)0x0) {
      (*(code *)Diligent::DebugMessageCallback)(2,LayerName,0,0,0);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)LayerName != &local_268) {
    operator_delete(LayerName,local_268._M_allocated_capacity + 1);
  }
LAB_0028de65:
  PhysicalDeviceCount = 0;
  VVar10 = (*vkEnumeratePhysicalDevices)(*ppVVar2,&PhysicalDeviceCount,(VkPhysicalDevice *)0x0);
  if (VVar10 != VK_SUCCESS) {
    LayerName = VkResultToString(VVar10);
    Diligent::LogError<false,char[36],char[12],char_const*>
              (false,"VulkanInstance",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanInstance.cpp"
               ,0x247,(char (*) [36])"Failed to get physical device count",
               (char (*) [12])"\nVK Error: ",&LayerName);
    Diligent::FormatString<char[6]>((string *)&LayerName,(char (*) [6])0x70efc6);
    Diligent::DebugAssertionFailed
              (LayerName,"VulkanInstance",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanInstance.cpp"
               ,0x247);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)LayerName != &local_268) {
      operator_delete(LayerName,local_268._M_allocated_capacity + 1);
    }
  }
  if (PhysicalDeviceCount == 0) {
    Diligent::LogError<true,char[40]>
              (false,"VulkanInstance",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanInstance.cpp"
               ,0x249,(char (*) [40])"No physical devices found on the system");
  }
  std::vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>::resize
            (this_02,(ulong)PhysicalDeviceCount);
  VVar10 = (*vkEnumeratePhysicalDevices)
                     (*ppVVar2,&PhysicalDeviceCount,
                      (this_02->
                      super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>
                      )._M_impl.super__Vector_impl_data._M_start);
  if (VVar10 != VK_SUCCESS) {
    LayerName = VkResultToString(VVar10);
    Diligent::LogError<false,char[37],char[12],char_const*>
              (false,"VulkanInstance",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanInstance.cpp"
               ,0x24e,(char (*) [37])"Failed to enumerate physical devices",
               (char (*) [12])"\nVK Error: ",&LayerName);
    Diligent::FormatString<char[6]>((string *)&LayerName,(char (*) [6])0x70efc6);
    Diligent::DebugAssertionFailed
              (LayerName,"VulkanInstance",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanInstance.cpp"
               ,0x24e);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)LayerName != &local_268) {
      operator_delete(LayerName,local_268._M_allocated_capacity + 1);
    }
  }
  if ((char (*) [48])
      ((long)(this->m_PhysicalDevices).
             super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>._M_impl
             .super__Vector_impl_data._M_finish -
       (long)(this->m_PhysicalDevices).
             super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>._M_impl
             .super__Vector_impl_data._M_start >> 3) != (char (*) [48])(ulong)PhysicalDeviceCount) {
    Diligent::FormatString<char[26],char[48]>
              ((string *)&LayerName,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_PhysicalDevices.size() == PhysicalDeviceCount",
               (char (*) [48])(ulong)PhysicalDeviceCount);
    Diligent::DebugAssertionFailed
              (LayerName,"VulkanInstance",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanInstance.cpp"
               ,0x24f);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)LayerName != &local_268) {
      operator_delete(LayerName,local_268._M_allocated_capacity + 1);
    }
  }
  Diligent::GLSLangUtils::InitializeGlslang();
LAB_0028e064:
  if (InstanceLayers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(InstanceLayers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)InstanceLayers.
                          super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)InstanceLayers.
                          super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(InstanceExtensions.
                    super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)InstanceExtensions.
                          super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)InstanceExtensions.
                          super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

VulkanInstance::VulkanInstance(const CreateInfo& CI) :
    m_pVkAllocator{CI.pVkAllocator}
{
#if DILIGENT_USE_VOLK
    if (volkInitialize() != VK_SUCCESS)
    {
        LOG_ERROR_AND_THROW("Failed to load Vulkan.");
    }
#endif

    {
        // Enumerate available layers
        uint32_t LayerCount = 0;

        auto res = vkEnumerateInstanceLayerProperties(&LayerCount, nullptr);
        CHECK_VK_ERROR_AND_THROW(res, "Failed to query layer count");
        m_Layers.resize(LayerCount);
        vkEnumerateInstanceLayerProperties(&LayerCount, m_Layers.data());
        CHECK_VK_ERROR_AND_THROW(res, "Failed to enumerate extensions");
        VERIFY_EXPR(LayerCount == m_Layers.size());
    }

    if (CI.LogExtensions)
    {
        if (!m_Layers.empty())
        {
            std::stringstream ss;
            for (const auto& Layer : m_Layers)
            {
                ss << "\n    "
                   << Layer.layerName << ' '
                   << VK_API_VERSION_MAJOR(Layer.specVersion) << '.'
                   << VK_API_VERSION_MINOR(Layer.specVersion) << '.'
                   << VK_API_VERSION_PATCH(Layer.specVersion);
            }
            LOG_INFO_MESSAGE("Available Vulkan instance layers: ", ss.str());
        }
        else
        {
            LOG_INFO_MESSAGE("No Vulkan instance layers found");
        }
    }

    // Enumerate available instance extensions
    if (!EnumerateInstanceExtensions(nullptr, m_Extensions))
        LOG_ERROR_AND_THROW("Failed to enumerate instance extensions");

    if (CI.LogExtensions)
    {
        if (!m_Extensions.empty())
            LOG_INFO_MESSAGE("Supported Vulkan instance extensions: ", PrintExtensionsList(m_Extensions, 1));
        else
            LOG_INFO_MESSAGE("No Vulkan instance extensions found");
    }

    std::vector<const char*> InstanceExtensions;
    if (IsExtensionAvailable(VK_KHR_SURFACE_EXTENSION_NAME))
    {
        InstanceExtensions.push_back(VK_KHR_SURFACE_EXTENSION_NAME);

        // Enable surface extensions depending on OS
#if defined(VK_USE_PLATFORM_WIN32_KHR)
        InstanceExtensions.push_back(VK_KHR_WIN32_SURFACE_EXTENSION_NAME);
#endif
#if defined(VK_USE_PLATFORM_ANDROID_KHR)
        InstanceExtensions.push_back(VK_KHR_ANDROID_SURFACE_EXTENSION_NAME);
#endif
#if defined(VK_USE_PLATFORM_WAYLAND_KHR)
        InstanceExtensions.push_back(VK_KHR_WAYLAND_SURFACE_EXTENSION_NAME);
#endif
#if defined(VK_USE_PLATFORM_XLIB_KHR)
        InstanceExtensions.push_back(VK_KHR_XLIB_SURFACE_EXTENSION_NAME);
#endif
#if defined(VK_USE_PLATFORM_XCB_KHR)
        InstanceExtensions.push_back(VK_KHR_XCB_SURFACE_EXTENSION_NAME);
#endif
#if defined(VK_USE_PLATFORM_METAL_EXT)
        InstanceExtensions.push_back(VK_EXT_METAL_SURFACE_EXTENSION_NAME);
#endif
    };

#if PLATFORM_MACOS
    // Beginning with the 1.3.216 Vulkan SDK, the Vulkan Loader is strictly
    // enforcing the new VK_KHR_PORTABILITY_subset extension.
    constexpr bool UsePortabilityEnumeartion = true;
#else
    constexpr bool UsePortabilityEnumeartion = false;
#endif

    if (UsePortabilityEnumeartion)
        InstanceExtensions.push_back(VK_KHR_PORTABILITY_ENUMERATION_EXTENSION_NAME);

    // This extension added to core in 1.1, but current version is 1.0
    if (IsExtensionAvailable(VK_KHR_GET_PHYSICAL_DEVICE_PROPERTIES_2_EXTENSION_NAME))
    {
        InstanceExtensions.push_back(VK_KHR_GET_PHYSICAL_DEVICE_PROPERTIES_2_EXTENSION_NAME);
    }

    for (const auto* ExtName : InstanceExtensions)
    {
        if (!IsExtensionAvailable(ExtName))
            LOG_ERROR_AND_THROW("Required extension ", ExtName, " is not available");
    }

    if (CI.ppExtensionNames != nullptr)
    {
        for (uint32_t ext = 0; ext < CI.ExtensionCount; ++ext)
        {
            const auto* ExtName = CI.ppExtensionNames[ext];
            if (ExtName == nullptr)
                continue;
            if (IsExtensionAvailable(ExtName))
                InstanceExtensions.push_back(ExtName);
            else
                LOG_WARNING_MESSAGE("Extension ", ExtName, " is not available");
        }
    }
    else
    {
        DEV_CHECK_ERR(CI.ExtensionCount == 0,
                      "Global extensions pointer is null while extensions count is ", CI.ExtensionCount,
                      ". Please initialize 'ppInstanceExtensionNames' member of EngineVkCreateInfo struct.");
    }

    uint32_t ApiVersion = CI.ApiVersion;
#if DILIGENT_USE_VOLK
    if (vkEnumerateInstanceVersion != nullptr && ApiVersion > VK_API_VERSION_1_0)
    {
        uint32_t MaxApiVersion = 0;
        vkEnumerateInstanceVersion(&MaxApiVersion);
        ApiVersion = std::min(ApiVersion, MaxApiVersion);
    }
    else
    {
        // Only Vulkan 1.0 is supported.
        ApiVersion = VK_API_VERSION_1_0;
    }
#else
    // Without Volk we can only use Vulkan 1.0
    ApiVersion = VK_API_VERSION_1_0;
#endif

#if DILIGENT_USE_OPENXR
    XrInstance                xrInstance            = XR_NULL_HANDLE;
    XrSystemId                xrSystemId            = XR_NULL_SYSTEM_ID;
    PFN_xrGetInstanceProcAddr xrGetInstanceProcAddr = nullptr;
    if (CI.XR.Instance != 0)
    {
        if (CI.XR.GetInstanceProcAddr == nullptr)
            LOG_ERROR_AND_THROW("xrGetInstanceProcAddr must not be null");

        static_assert(sizeof(XrInstance) == sizeof(CI.XR.Instance), "XrInstance size mismatch");
        memcpy(&xrInstance, &CI.XR.Instance, sizeof(XrInstance));
        static_assert(sizeof(XrSystemId) == sizeof(CI.XR.SystemId), "XrSystemId size mismatch");
        memcpy(&xrSystemId, &CI.XR.SystemId, sizeof(XrSystemId));
        xrGetInstanceProcAddr = reinterpret_cast<PFN_xrGetInstanceProcAddr>(CI.XR.GetInstanceProcAddr);
    }
    if (xrInstance != 0)
    {
        ApiVersion = GetRequiredOpenXRVulkanVersion(ApiVersion, xrInstance, xrSystemId, xrGetInstanceProcAddr);
    }
#endif

    std::vector<const char*> InstanceLayers;

    // Use VK_DEVSIM_FILENAME environment variable to define the simulation layer
    if (CI.EnableDeviceSimulation)
    {
        static const char* DeviceSimulationLayer = "VK_LAYER_LUNARG_device_simulation";

        uint32_t LayerVer = 0;
        if (IsLayerAvailable(DeviceSimulationLayer, LayerVer))
        {
            InstanceLayers.push_back(DeviceSimulationLayer);
        }
    }

    if (CI.EnableValidation)
    {
        if (IsExtensionAvailable(VK_EXT_DEBUG_UTILS_EXTENSION_NAME))
        {
            // Prefer VK_EXT_debug_utils
            m_DebugMode = DebugMode::Utils;
        }
        else if (IsExtensionAvailable(VK_EXT_DEBUG_REPORT_EXTENSION_NAME))
        {
            // If debug utils are unavailable (e.g. on Android), use VK_EXT_debug_report
            m_DebugMode = DebugMode::Report;
        }

        for (const auto* LayerName : ValidationLayerNames)
        {
            uint32_t LayerVer = ~0u;
            if (!IsLayerAvailable(LayerName, LayerVer))
            {
                LOG_WARNING_MESSAGE("Validation layer ", LayerName, " is not available.");
                continue;
            }

            // Beta extensions may vary and result in a crash.
            // New enums are not supported and may cause validation error.
            if (LayerVer < VK_HEADER_VERSION_COMPLETE)
            {
                LOG_WARNING_MESSAGE("Layer '", LayerName, "' version (", VK_API_VERSION_MAJOR(LayerVer), '.', VK_API_VERSION_MINOR(LayerVer), '.', VK_API_VERSION_PATCH(LayerVer),
                                    ") is less than the header version (",
                                    VK_API_VERSION_MAJOR(VK_HEADER_VERSION_COMPLETE), '.', VK_API_VERSION_MINOR(VK_HEADER_VERSION_COMPLETE), '.', VK_API_VERSION_PATCH(VK_HEADER_VERSION_COMPLETE),
                                    ").");
            }

            InstanceLayers.push_back(LayerName);

            if (m_DebugMode != DebugMode::Utils)
            {
                // On Android, VK_EXT_debug_utils extension may not be supported by the loader,
                // but supported by the layer.
                std::vector<VkExtensionProperties> LayerExtensions;
                if (EnumerateInstanceExtensions(LayerName, LayerExtensions))
                {
                    if (VulkanUtilities::IsExtensionAvailable(LayerExtensions, VK_EXT_DEBUG_UTILS_EXTENSION_NAME))
                        m_DebugMode = DebugMode::Utils;

                    if (m_DebugMode == DebugMode::Disabled && VulkanUtilities::IsExtensionAvailable(LayerExtensions, VK_EXT_DEBUG_REPORT_EXTENSION_NAME))
                        m_DebugMode = DebugMode::Report; // Resort to debug report
                }
                else
                {
                    LOG_ERROR_MESSAGE("Failed to enumerate extensions for ", LayerName, " layer");
                }
            }
        }


        if (m_DebugMode == DebugMode::Utils)
            InstanceExtensions.push_back(VK_EXT_DEBUG_UTILS_EXTENSION_NAME);
        else if (m_DebugMode == DebugMode::Report)
            InstanceExtensions.push_back(VK_EXT_DEBUG_REPORT_EXTENSION_NAME);
        else
            LOG_WARNING_MESSAGE("Neither ", VK_EXT_DEBUG_UTILS_EXTENSION_NAME, " nor ", VK_EXT_DEBUG_REPORT_EXTENSION_NAME, " extension is available. Debug tools (validation layer message logging, performance markers, etc.) will be disabled.");
    }

    if (CI.ppEnabledLayerNames != nullptr)
    {
        for (size_t i = 0; i < CI.EnabledLayerCount; ++i)
        {
            const auto* LayerName = CI.ppEnabledLayerNames[i];
            if (LayerName == nullptr)
                return;
            uint32_t LayerVer = 0;
            if (IsLayerAvailable(LayerName, LayerVer))
                InstanceLayers.push_back(LayerName);
            else
                LOG_WARNING_MESSAGE("Instance layer ", LayerName, " is not available");
        }
    }

    VkApplicationInfo appInfo{};
    appInfo.sType              = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    appInfo.pNext              = nullptr; // Pointer to an extension-specific structure.
    appInfo.pApplicationName   = nullptr;
    appInfo.applicationVersion = 0; // Developer-supplied version number of the application
    appInfo.pEngineName        = "Diligent Engine";
    appInfo.engineVersion      = DILIGENT_API_VERSION; // Developer-supplied version number of the engine used to create the application.
    appInfo.apiVersion         = ApiVersion;

    VkInstanceCreateInfo InstanceCreateInfo{};
    InstanceCreateInfo.sType = VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO;
    InstanceCreateInfo.pNext = nullptr; // Pointer to an extension-specific structure.
    InstanceCreateInfo.flags = 0;
    if (UsePortabilityEnumeartion)
    {
        // The instance will enumerate available Vulkan Portability-compliant physical
        // devices and groups in addition to the Vulkan physical devices and groups that
        // are enumerated by default.
        InstanceCreateInfo.flags |= VK_INSTANCE_CREATE_ENUMERATE_PORTABILITY_BIT_KHR;
    }
    InstanceCreateInfo.pApplicationInfo        = &appInfo;
    InstanceCreateInfo.enabledExtensionCount   = static_cast<uint32_t>(InstanceExtensions.size());
    InstanceCreateInfo.ppEnabledExtensionNames = InstanceExtensions.empty() ? nullptr : InstanceExtensions.data();
    InstanceCreateInfo.enabledLayerCount       = static_cast<uint32_t>(InstanceLayers.size());
    InstanceCreateInfo.ppEnabledLayerNames     = InstanceLayers.empty() ? nullptr : InstanceLayers.data();

    VkResult res = VK_ERROR_UNKNOWN;
#if DILIGENT_USE_OPENXR
    if (xrInstance != XR_NULL_HANDLE)
    {
        res = CreateVkInstanceForOpenXR(xrInstance, xrSystemId, xrGetInstanceProcAddr, &InstanceCreateInfo, m_pVkAllocator, &m_VkInstance);
    }
    else
#endif
    {
        res = vkCreateInstance(&InstanceCreateInfo, m_pVkAllocator, &m_VkInstance);
    }
    CHECK_VK_ERROR_AND_THROW(res, "Failed to create Vulkan instance");

#if DILIGENT_USE_VOLK
    volkLoadInstance(m_VkInstance);
#endif

    m_EnabledExtensions = std::move(InstanceExtensions);
    m_VkVersion         = ApiVersion;

    // If requested, we enable the default validation layers for debugging
    if (m_DebugMode == DebugMode::Utils)
    {
        constexpr VkDebugUtilsMessageSeverityFlagsEXT messageSeverity =
            VK_DEBUG_UTILS_MESSAGE_SEVERITY_WARNING_BIT_EXT |
            VK_DEBUG_UTILS_MESSAGE_SEVERITY_ERROR_BIT_EXT;
        constexpr VkDebugUtilsMessageTypeFlagsEXT messageType =
            VK_DEBUG_UTILS_MESSAGE_TYPE_GENERAL_BIT_EXT |
            VK_DEBUG_UTILS_MESSAGE_TYPE_VALIDATION_BIT_EXT |
            VK_DEBUG_UTILS_MESSAGE_TYPE_PERFORMANCE_BIT_EXT;
        if (!VulkanUtilities::SetupDebugUtils(m_VkInstance, messageSeverity, messageType, CI.IgnoreDebugMessageCount, CI.ppIgnoreDebugMessageNames, nullptr))
            LOG_ERROR_MESSAGE("Failed to initialize debug utils. Validation layer message logging, performance markers, etc. will be disabled.");
    }
    else if (m_DebugMode == DebugMode::Report)
    {
        constexpr VkDebugReportFlagBitsEXT flags = static_cast<VkDebugReportFlagBitsEXT>(
            VK_DEBUG_REPORT_WARNING_BIT_EXT |
            VK_DEBUG_REPORT_PERFORMANCE_WARNING_BIT_EXT |
            VK_DEBUG_REPORT_ERROR_BIT_EXT);
        if (!VulkanUtilities::SetupDebugReport(m_VkInstance, flags, nullptr))
            LOG_ERROR_MESSAGE("Failed to initialize debug report. Validation layer message logging will be disabled.");
    }

    // Enumerate physical devices
    {
        // Physical device
        uint32_t PhysicalDeviceCount = 0;
        // Get the number of available physical devices
        auto err = vkEnumeratePhysicalDevices(m_VkInstance, &PhysicalDeviceCount, nullptr);
        CHECK_VK_ERROR(err, "Failed to get physical device count");
        if (PhysicalDeviceCount == 0)
            LOG_ERROR_AND_THROW("No physical devices found on the system");

        // Enumerate devices
        m_PhysicalDevices.resize(PhysicalDeviceCount);
        err = vkEnumeratePhysicalDevices(m_VkInstance, &PhysicalDeviceCount, m_PhysicalDevices.data());
        CHECK_VK_ERROR(err, "Failed to enumerate physical devices");
        VERIFY_EXPR(m_PhysicalDevices.size() == PhysicalDeviceCount);
    }
#if !DILIGENT_NO_GLSLANG
    Diligent::GLSLangUtils::InitializeGlslang();
#endif
}